

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

String * __thiscall LiteScript::String::operator*=(String *this,uint nb)

{
  char32_t local_3c;
  undefined1 local_38 [4];
  uint i;
  u32string string;
  uint nb_local;
  String *this_local;
  
  string.field_2._M_local_buf[3] = nb;
  std::__cxx11::u32string::u32string((u32string *)local_38,&this->str);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::clear
            (&this->str);
  for (local_3c = L'\0'; (uint)local_3c < (uint)string.field_2._M_local_buf[3];
      local_3c = local_3c + L'\x01') {
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator+=(&this->str,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_38);
  }
  std::__cxx11::u32string::~u32string((u32string *)local_38);
  return this;
}

Assistant:

LiteScript::String& LiteScript::String::operator*=(unsigned int nb) {
    std::u32string string = this->str;
    this->str.clear();
    for (unsigned int i = 0; i < nb; i++)
        this->str += string;
    return *this;
}